

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O2

void pnga_error(char *string,Integer icode)

{
  ulong uVar1;
  size_t sVar2;
  char error_buffer [400];
  char acStack_1b8 [408];
  
  uVar1 = pnga_nodeid();
  sprintf(acStack_1b8,"%d:",uVar1 & 0xffffffff);
  strcat(acStack_1b8,string);
  sVar2 = strlen(acStack_1b8);
  (acStack_1b8 + sVar2)[0] = ':';
  (acStack_1b8 + sVar2)[1] = '\0';
  ARMCI_Error(acStack_1b8,-(uint)(icode == 0) | (uint)icode);
  return;
}

Assistant:

void pnga_error(char *string, Integer icode)
{
#ifndef ARMCI
extern void Error();
#endif

#define FOUT stderr
#define ERR_LEN 400
    int level;
    char error_buffer[ERR_LEN];

    /* JAD 02/23/2012 for applications, an exit/error code of 0 indicates
     * success, it is therefore wrong to call pnga_error with a zero value */
    if (icode == 0) {
        icode = -1;
    }

    /* print GA names stack */
    sprintf(error_buffer,"%d:", (int)pnga_nodeid());
    strcat(error_buffer,string);
    strcat(error_buffer,":");
       
#ifdef ARMCI
    ARMCI_Error(error_buffer,(int)icode);
#else
    ga_clean_resources(); 
    if (pnga_nnodes() > 1) Error(error_buffer, icode);
    else{
      fprintf(FOUT,"%s %ld\n",error_buffer,icode);
      perror("system message:");
      fflush(FOUT);
      exit(1);
    }
#endif
}